

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lipm-dcm-estimator.cpp
# Opt level: O3

void __thiscall
stateObservation::LipmDcmEstimator::resetWithMeasurements
          (LipmDcmEstimator *this,Vector2 *measuredDcm,Vector2 *measuredZMP,Matrix2 *yaw,
          bool measurementIsWithBias,Vector2 *initBias,Vector2 *initBiasuncertainty)

{
  PointerType *ppdVar1;
  double dVar2;
  double dVar3;
  undefined8 uVar4;
  assign_op<double,_double> *paVar5;
  variable_if_dynamic<long,__1> vVar6;
  DstEvaluatorType dstEvaluator_1;
  undefined1 *puVar7;
  Matrix<double,_4,_4,_0,_4,_4> *pMVar8;
  CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *pCVar9;
  long lVar10;
  ulong uVar11;
  undefined8 *puVar12;
  char *__function;
  SrcEvaluatorType srcEvaluator;
  undefined3 in_register_00000081;
  SrcEvaluatorType srcEvaluator_3;
  SrcEvaluatorType srcEvaluator_1;
  DstEvaluatorType dstEvaluator;
  SrcEvaluatorType srcEvaluator_2;
  Matrix4 P;
  Vector4 x;
  SrcEvaluatorType srcEvaluator_4;
  DstEvaluatorType dstEvaluator_2;
  assign_op<double,_double> local_199;
  DstXprType local_198;
  KalmanFilterBase *local_160;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,_const_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_158;
  undefined1 local_138 [32];
  double local_118;
  Vector2 *pVStack_110;
  Vector2 *local_108;
  double dStack_100;
  Matrix<double,_4,_4,_0,_4,_4> local_f8;
  undefined1 local_78 [32];
  SrcEvaluatorType local_58;
  DstEvaluatorType local_40;
  
  local_160 = &(this->filter_).super_KalmanFilterBase;
  KalmanFilterBase::reset(local_160);
  dVar2 = (measuredZMP->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
          m_data.array[1];
  (this->previousZmp_).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data
  .array[0] = (measuredZMP->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
              m_data.array[0];
  (this->previousZmp_).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data
  .array[1] = dVar2;
  dVar2 = (yaw->super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).m_storage.m_data.array
          [1];
  (this->previousOrientation_).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
  m_storage.m_data.array[0] =
       (yaw->super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).m_storage.m_data.array[0]
  ;
  (this->previousOrientation_).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
  m_storage.m_data.array[1] = dVar2;
  dVar2 = (yaw->super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).m_storage.m_data.array
          [3];
  (this->previousOrientation_).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
  m_storage.m_data.array[2] =
       (yaw->super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).m_storage.m_data.array[2]
  ;
  (this->previousOrientation_).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
  m_storage.m_data.array[3] = dVar2;
  local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
       (double)local_78;
  if (CONCAT31(in_register_00000081,measurementIsWithBias) == 0) {
    local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1]
         = 0.0;
    local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2]
         = 4.94065645841247e-324;
    local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3]
         = 9.88131291682493e-324;
    local_78._0_8_ =
         (measuredDcm->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
         m_data.array[0];
    local_78._8_8_ =
         (measuredDcm->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
         m_data.array[1];
    Eigen::CommaInitializer<Eigen::Matrix<double,4,1,0,4,1>>::operator_
              ((CommaInitializer<Eigen::Matrix<double,4,1,0,4,1>> *)&local_f8,
               (DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)initBias);
    puVar7 = (undefined1 *)
             ((long)(((PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
                     local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                     .m_data.array[3])->m_storage).m_data.array +
             (long)local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[1]);
    paVar5 = (assign_op<double,_double> *)
             local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array[2];
  }
  else {
    local_158.m_src = (SrcEvaluatorType *)0x0;
    local_158.m_functor = (assign_op<double,_double> *)0x1;
    local_158.m_dstExpr = (DstXprType *)0x2;
    local_198.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_xpr =
         &local_f8;
    local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1]
         = 9.88131291682493e-324;
    local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2]
         = 4.94065645841247e-324;
    local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[4]
         = 0.0;
    local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[5]
         = 0.0;
    local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[6]
         = 1.97626258336499e-323;
    local_198.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_rows.
    m_value = (long)&local_118;
    local_198.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_data =
         (PointerType)local_138;
    local_198.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_cols.
    m_value = (long)&local_58;
    local_158.m_dst =
         (DstEvaluatorType *)
         local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
         array[0];
    local_138._0_8_ =
         local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
         array[0];
    pVStack_110 = measuredDcm;
    local_108 = initBias;
    local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3]
         = local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
           array[0];
    Eigen::internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
           *)&local_198);
    Eigen::CommaInitializer<Eigen::Matrix<double,4,1,0,4,1>>::operator_
              ((CommaInitializer<Eigen::Matrix<double,4,1,0,4,1>> *)&local_158,
               (DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)initBias);
    puVar7 = &((local_158.m_src)->
              super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,_const_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
              ).m_d.field_0x0 +
             (long)&((local_158.m_dstExpr)->
                    super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
                    ).
                    super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>
                    .
                    super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>
    ;
    paVar5 = local_158.m_functor;
  }
  if ((puVar7 == (undefined1 *)0x4) && (paVar5 == (assign_op<double,_double> *)0x1)) {
    local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
         = 0.0;
    local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1]
         = 0.0;
    pMVar8 = (Matrix<double,_4,_4,_0,_4,_4> *)malloc(0x20);
    if (((ulong)pMVar8 & 0xf) != 0) {
      __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                    "void *Eigen::internal::aligned_malloc(std::size_t)");
    }
    if (pMVar8 == (Matrix<double,_4,_4,_0,_4,_4> *)0x0) {
      puVar12 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar12 = operator_delete;
      __cxa_throw(puVar12,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1]
         = 1.97626258336499e-323;
    (pMVar8->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0]
         = (double)local_78._0_8_;
    (pMVar8->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[1]
         = (double)local_78._8_8_;
    (pMVar8->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[2]
         = (double)local_78._16_8_;
    (pMVar8->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[3]
         = (double)local_78._24_8_;
    local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
         = (double)pMVar8;
    ZeroDelayObserver::setState(&local_160->super_ZeroDelayObserver,(StateVector *)&local_f8,0);
    free((void *)local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                 m_data.array[0]);
    local_198.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_data =
         (PointerType)&local_f8;
    if (measurementIsWithBias) {
      local_118 = (initBiasuncertainty->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>
                  ).m_storage.m_data.array[0];
      dStack_100 = (initBiasuncertainty->
                   super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
                   array[1];
      local_118 = local_118 * local_118;
      dStack_100 = dStack_100 * dStack_100;
      pVStack_110 = (Vector2 *)0x0;
      local_108 = (Vector2 *)0x0;
      local_58.
      super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,_const_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
      .m_d.rhsImpl.super_evaluator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
      super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>.m_d.data =
           (evaluator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>)&this->R_;
      local_138._8_8_ = 0.0;
      local_138._16_8_ = (assign_op<double,_double> *)0x2;
      local_138._24_8_ = 9.88131291682493e-324;
      local_158.m_dstExpr = &local_198;
      local_198.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_rows.
      m_value = 2;
      local_198.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_cols.
      m_value = 2;
      local_198.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_startRow.
      m_value = 0;
      local_198.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_startCol.
      m_value = 0;
      local_198.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_outerStride
           = 4;
      local_158.m_src = &local_58;
      local_158.m_dst = &local_40;
      local_158.m_functor = &local_199;
      local_198.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_xpr =
           &local_f8;
      local_138._0_8_ = &local_f8;
      local_58.
      super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,_const_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
      .m_d.lhsImpl.super_evaluator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
      super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>.m_d.data =
           (evaluator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>)
           (evaluator<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>)&local_118;
      local_40.super_block_evaluator<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
      super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,_4,_4>_>
      .m_data = (PointerType)&local_f8;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,_const_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
      ::run(&local_158);
      local_198.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_data =
           &local_118;
      pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>>::operator_
                         ((CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>> *)local_138,
                          (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                           *)&local_198);
      local_158.m_dst = (DstEvaluatorType *)&local_118;
      pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>>::operator_
                         ((CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>> *)pCVar9,
                          (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                           *)&local_158);
      Eigen::CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>>::operator_
                ((CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>> *)pCVar9,
                 (DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)&local_118);
      lVar10 = local_138._24_8_ + local_138._8_8_;
      vVar6.m_value = local_138._16_8_;
    }
    else {
      local_198.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_rows.
      m_value = 0;
      local_198.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_cols.
      m_value = 2;
      local_198.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_xpr =
           (Matrix<double,_4,_4,_0,_4,_4> *)0x2;
      local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0] = (this->R_).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data
            .array[0];
      local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [1] = (this->R_).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data
            .array[1];
      local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [4] = (this->R_).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data
            .array[2];
      local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [5] = (this->R_).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data
            .array[3];
      pVStack_110 = (Vector2 *)0x0;
      pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>>::operator_
                         ((CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>> *)&local_198,
                          (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                           *)&local_118);
      local_138._8_8_ = 0.0;
      pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>>::operator_
                         ((CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>> *)pCVar9,
                          (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                           *)local_138);
      dVar2 = (initBiasuncertainty->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).
              m_storage.m_data.array[0];
      dVar3 = (initBiasuncertainty->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).
              m_storage.m_data.array[1];
      local_158.m_dst = (DstEvaluatorType *)(dVar2 * dVar2);
      local_158.m_dstExpr = (DstXprType *)(dVar3 * dVar3);
      local_158.m_src = (SrcEvaluatorType *)0x0;
      local_158.m_functor = (assign_op<double,_double> *)0x0;
      Eigen::CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>>::operator_
                ((CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>> *)pCVar9,
                 (DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)&local_158);
      lVar10 = (long)((local_198.
                       super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
                       .
                       super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>
                      .m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
                     m_storage.m_data.array +
               local_198.
               super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
               super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
               super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
               super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.
               m_rows.m_value;
      vVar6.m_value =
           local_198.
           super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.
           m_cols.m_value;
    }
    if ((lVar10 == 4) &&
       ((assign_op<double,_double> *)vVar6.m_value == (assign_op<double,_double> *)0x4)) {
      local_198.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_data =
           (PointerType)0x0;
      local_198.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_rows.
      m_value = 0;
      local_198.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_cols.
      m_value = 0;
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                ((DenseStorage<double,__1,__1,__1,_0> *)&local_198,0x10,4,4);
      if ((((SrcEvaluatorType *)
            local_198.
            super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.
            m_rows.m_value != (SrcEvaluatorType *)0x4) ||
          ((assign_op<double,_double> *)
           local_198.
           super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.
           m_cols.m_value != (assign_op<double,_double> *)0x4)) &&
         ((Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                     ((DenseStorage<double,__1,__1,__1,_0> *)&local_198,0x10,4,4),
          (SrcEvaluatorType *)
          local_198.
          super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_rows
          .m_value != (SrcEvaluatorType *)0x4 ||
          ((assign_op<double,_double> *)
           local_198.
           super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.
           m_cols.m_value != (assign_op<double,_double> *)0x4)))) {
        __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                      "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, -1>, SrcXprType = Eigen::Matrix<double, 4, 4>, T1 = double, T2 = double]"
                     );
      }
      uVar11 = 0xfffffffffffffffe;
      do {
        uVar4 = local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[uVar11 + 3];
        ppdVar1 = &(((DstEvaluatorType *)
                    ((long)local_198.
                           super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
                           .
                           super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
                           .m_data + 0x10))->
                   super_block_evaluator<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,__1,_false,_true>)
                   .
                   super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,_4,_1>_>
                   .m_data + uVar11;
        *ppdVar1 = (PointerType)
                   local_f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[uVar11 + 2];
        ppdVar1[1] = (PointerType)uVar4;
        uVar11 = uVar11 + 2;
      } while (uVar11 < 0xe);
      KalmanFilterBase::setStateCovariance(local_160,(Pmatrix *)&local_198);
      free(local_198.
           super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.
           m_data);
      return;
    }
    __function = 
    "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 4, 4>>::finished() [MatrixType = Eigen::Matrix<double, 4, 4>]"
    ;
  }
  else {
    __function = 
    "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 4, 1>>::finished() [MatrixType = Eigen::Matrix<double, 4, 1>]"
    ;
  }
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,__function);
}

Assistant:

void LipmDcmEstimator::resetWithMeasurements(const Vector2 & measuredDcm,
                                             const Vector2 & measuredZMP,
                                             const Matrix2 & yaw,
                                             bool measurementIsWithBias,
                                             const Vector2 & initBias,
                                             const Vector2 & initBiasuncertainty)

{
  filter_.reset();
  previousZmp_ = measuredZMP;
  previousOrientation_ = yaw;

  Vector4 x;

  /// initialize the state using the measurement
  if(measurementIsWithBias)
  {
    x << measuredDcm - initBias, initBias;
  }
  else
  {
    x << measuredDcm, initBias;
  }

  filter_.setState(x, 0);
  Matrix4 P;

  if(measurementIsWithBias)
  {
    Matrix2 initBiasCov = Vec2ToSqDiag_(initBiasuncertainty);
    /// The state and the
    // clang-format off
    P<< initBiasCov+R_, -initBiasCov,
       -initBiasCov,     initBiasCov;
    // clang-format on
  }
  else
  {
    // clang-format off
    P<< R_,               Matrix2::Zero(),
        Matrix2::Zero(),  Vec2ToSqDiag_(initBiasuncertainty);
    // clang-format on
  }

  filter_.setStateCovariance(P);
}